

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::erase(vector<int,_false,_6> *this,size_type_conflict pos)

{
  vector<int,_false,_6> vStack_28;
  vector<int,_false,_6> local_20;
  
  take(&local_20,pos);
  drop(&vStack_28,pos);
  operator+((immutable *)this,&local_20,&vStack_28);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&vStack_28._impl);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_20._impl);
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector erase(size_type pos) const
        {        
        return take(pos) + drop(pos + 1);
        }